

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall HPresolve::removeFreeColumnSingleton(HPresolve *this,int col,int row,int k)

{
  int *piVar1;
  iterator *piVar2;
  double *__args;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  double *pdVar7;
  _Elt_pointer pcVar8;
  ostream *poVar9;
  pointer piVar10;
  pointer piVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  timeval tv_1;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> newCosts;
  pair<int,_double> local_68;
  value_type local_58;
  ulong local_40;
  ulong local_38;
  
  gettimeofday((timeval *)&local_58,(__timezone_ptr_t)0x0);
  (this->timer).itemStart[7] =
       (double)(long)local_58.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish / 1000000.0 +
       (double)(long)local_58.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  if (0 < this->iPrint) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"PR: Free column singleton ",0x1a);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,col);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," removed. Row ",0xe);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,row);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," removed.",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  local_58.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pair<int,_double> *)0x0;
  local_58.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<int,_double> *)0x0;
  uVar14 = (ulong)row;
  piVar10 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar11 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar12 = (long)piVar11 - (long)piVar10 >> 2;
  uVar15 = uVar14;
  if ((uVar14 < uVar12) &&
     (uVar19 = (ulong)(row + 1), uVar15 = uVar19, local_38 = (ulong)(uint)row, uVar19 < uVar12)) {
    uVar12 = (ulong)piVar10[uVar14];
    uVar16 = (ulong)col;
    uVar17 = (ulong)k;
    local_40 = uVar14;
    do {
      uVar14 = local_38;
      uVar15 = local_40;
      if ((long)piVar10[uVar19] <= (long)uVar12) {
        if (this->iKKTcheck == 1) {
          std::
          deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
          ::push_back(&(this->super_HPreData).chk.costs.c,&local_58);
        }
        piVar10 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar12 = uVar16;
        if (uVar16 < (ulong)((long)(this->super_HPreData).flagCol.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar10 >> 2)) {
          piVar10[uVar16] = 0;
          pdVar4 = (this->super_HPreData).colCost.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (uVar16 < (ulong)((long)(this->super_HPreData).colCost.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar4 >> 3)) {
            __args = pdVar4 + uVar16;
            pdVar7 = (this->super_HPreData).postValue.c.
                     super__Deque_base<double,_std::allocator<double>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
            if (pdVar7 == *(_Elt_pointer *)
                           ((long)&(this->super_HPreData).postValue.c.
                                   super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                   super__Deque_impl_data._M_finish + 0x10) + -1) {
              std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                        ((deque<double,std::allocator<double>> *)&(this->super_HPreData).postValue,
                         __args);
            }
            else {
              *pdVar7 = *__args;
              (this->super_HPreData).postValue.c.super__Deque_base<double,_std::allocator<double>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur = pdVar7 + 1;
            }
            iVar18 = (int)uVar14;
            fillStackRowBounds(this,iVar18);
            pdVar4 = (this->super_HPreData).valueColDual.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (uVar16 < (ulong)((long)(this->super_HPreData).valueColDual.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pdVar4 >> 3)) {
              pdVar4[uVar16] = 0.0;
              pdVar4 = (this->super_HPreData).colCost.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (((uVar16 < (ulong)((long)(this->super_HPreData).colCost.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4
                                    >> 3)) &&
                  (pdVar5 = (this->super_HPreData).Avalue.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start, uVar12 = uVar17,
                  uVar17 < (ulong)((long)(this->super_HPreData).Avalue.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish - (long)pdVar5 >> 3)))
                 && (pdVar6 = (this->super_HPreData).valueRowDual.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start, uVar12 = uVar15,
                    uVar15 < (ulong)((long)(this->super_HPreData).valueRowDual.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6
                                    >> 3))) {
                pdVar6[uVar15] = -pdVar4[uVar16] / pdVar5[uVar17];
                local_68.first = 7;
                local_68.second = (double)CONCAT44(local_68.second._4_4_,col);
                pcVar8 = (this->super_HPreData).chng.c.
                         super__Deque_base<change,_std::allocator<change>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_cur;
                local_68._4_4_ = iVar18;
                if (pcVar8 == *(_Elt_pointer *)
                               ((long)&(this->super_HPreData).chng.c.
                                       super__Deque_base<change,_std::allocator<change>_>._M_impl.
                                       super__Deque_impl_data._M_finish + 0x10) + -1) {
                  std::deque<change,std::allocator<change>>::_M_push_back_aux<change_const&>
                            ((deque<change,std::allocator<change>> *)&(this->super_HPreData).chng,
                             (change *)&local_68);
                }
                else {
                  pcVar8->col = col;
                  pcVar8->type = 7;
                  pcVar8->row = iVar18;
                  piVar2 = &(this->super_HPreData).chng.c.
                            super__Deque_base<change,_std::allocator<change>_>._M_impl.
                            super__Deque_impl_data._M_finish;
                  piVar2->_M_cur = piVar2->_M_cur + 1;
                }
                removeRow(this,iVar18);
                piVar1 = (this->countRemovedCols).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start + 7;
                *piVar1 = *piVar1 + 1;
                piVar1 = (this->countRemovedRows).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start + 7;
                *piVar1 = *piVar1 + 1;
                gettimeofday((timeval *)&local_68,(__timezone_ptr_t)0x0);
                (this->timer).itemTicks[7] =
                     (((double)(long)local_68.second / 1000000.0 +
                      (double)CONCAT44(local_68._4_4_,local_68.first)) - (this->timer).itemStart[7])
                     + (this->timer).itemTicks[7];
                if (local_58.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_58.
                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                return;
              }
            }
          }
        }
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar12);
      }
      piVar3 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar15 = uVar12;
      if ((ulong)((long)(this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar12)
      break;
      iVar18 = piVar3[uVar12];
      uVar14 = (ulong)iVar18;
      piVar3 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar15 = uVar14;
      if ((ulong)((long)(this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar14)
      break;
      if ((iVar18 != col) && (piVar3[uVar14] != 0)) {
        pdVar4 = (this->super_HPreData).colCost.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->super_HPreData).colCost.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar14) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar14);
        }
        local_68.second = pdVar4[uVar14];
        local_68.first = iVar18;
        if (local_58.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_58.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
          _M_realloc_insert<std::pair<int,double>>
                    ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                     &local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        }
        else {
          *(ulong *)local_58.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = CONCAT44(local_68._4_4_,iVar18);
          (local_58.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish)->second = local_68.second;
          local_58.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_58.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pdVar4 = (this->super_HPreData).colCost.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar13 = (long)(this->super_HPreData).colCost.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
        if (((uVar13 <= uVar14) || (uVar15 = uVar16, uVar13 <= uVar16)) ||
           ((pdVar5 = (this->super_HPreData).ARvalue.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start, uVar15 = uVar12,
            (ulong)((long)(this->super_HPreData).ARvalue.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar12 ||
            (pdVar6 = (this->super_HPreData).Avalue.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start, uVar15 = uVar17,
            (ulong)((long)(this->super_HPreData).Avalue.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar17))))
        break;
        pdVar4[uVar14] = pdVar4[uVar14] - (pdVar4[uVar16] * pdVar5[uVar12]) / pdVar6[uVar17];
        piVar10 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        piVar11 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar12 = uVar12 + 1;
      uVar15 = uVar19;
    } while (uVar19 < (ulong)((long)piVar11 - (long)piVar10 >> 2));
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar15);
}

Assistant:

void HPresolve::removeFreeColumnSingleton(const int col, const int row, const int k) {
	timer.recordStart(FREE_SING_COL);
	if (iPrint > 0)
		cout << "PR: Free column singleton " << col << " removed. Row " << row
				<< " removed." << endl;

	//modify costs
	vector<pair<int, double> > newCosts;
	int j;
	for (int kk = ARstart.at(row); kk < ARstart.at(row + 1); ++kk) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j != col) {
			newCosts.push_back(make_pair(j, colCost.at(j)));
			colCost.at(j) = colCost.at(j)
					- colCost.at(col) * ARvalue.at(kk) / Avalue.at(k);
		}
	}
	if (iKKTcheck == 1)
		chk.costs.push(newCosts);

	flagCol.at(col) = 0;
	postValue.push(colCost.at(col));
	fillStackRowBounds (row);

	valueColDual.at(col) = 0;
	valueRowDual.at(row) = -colCost.at(col) / Avalue.at(k);

	addChange(FREE_SING_COL, row, col);
	removeRow(row);

	countRemovedCols[FREE_SING_COL]++;
	countRemovedRows[FREE_SING_COL]++;
	timer.recordFinish(FREE_SING_COL);
}